

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void glcts::prepareLodForFace(GLfloat *lods,GLuint n_mipmap_levels)

{
  float fVar1;
  GLfloat top_level;
  GLfloat base_level;
  GLuint n_mipmap_levels_local;
  GLfloat *lods_local;
  
  fVar1 = (float)(n_mipmap_levels - 1);
  *lods = 0.0;
  lods[1] = fVar1;
  lods[2] = 0.0;
  lods[3] = fVar1;
  lods[4] = 0.0;
  lods[5] = fVar1;
  lods[6] = 0.0;
  lods[7] = fVar1;
  lods[8] = 0.0;
  return;
}

Assistant:

void prepareLodForFace(glw::GLfloat* lods, glw::GLuint n_mipmap_levels)
{
	const glw::GLfloat base_level = 0.0f;
	const glw::GLfloat top_level  = (glw::GLfloat)(n_mipmap_levels - 1);

	lods[0] = base_level;
	lods[1] = top_level;
	lods[2] = base_level;
	lods[3] = top_level;
	lods[4] = base_level;
	lods[5] = top_level;
	lods[6] = base_level;
	lods[7] = top_level;
	lods[8] = base_level;
}